

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

void sysbvm_dwarf_debugInfo_attribute_beginLocationExpression
               (sysbvm_dwarf_debugInfo_builder_t *builder,uintptr_t attribute)

{
  uintptr_t attribute_local;
  sysbvm_dwarf_debugInfo_builder_t *builder_local;
  
  sysbvm_dwarf_encodeULEB128(&builder->abbrev,attribute);
  sysbvm_dwarf_encodeULEB128(&builder->abbrev,0x18);
  return;
}

Assistant:

SYSBVM_API void sysbvm_dwarf_debugInfo_attribute_beginLocationExpression(sysbvm_dwarf_debugInfo_builder_t *builder, uintptr_t attribute)
{
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, attribute);
    sysbvm_dwarf_encodeULEB128(&builder->abbrev, DW_FORM_exprloc);
}